

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightlist.h
# Opt level: O0

void __thiscall
Common::lightlist<ICM::Object*>::lightlist<ICM::Object*const*>
          (lightlist<ICM::Object*> *this,Object **begin,Object **end)

{
  element_type *p;
  Object **__result;
  Object **end_local;
  Object **begin_local;
  lightlist<ICM::Object_*> *this_local;
  
  lightlist<ICM::Object_*>::lightlist((lightlist<ICM::Object_*> *)this,(long)end - (long)begin >> 3)
  ;
  p = std::__shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2> *)(this + 8));
  __result = _PointerIterator<ICM::Object*>(p);
  std::copy<ICM::Object*const*,ICM::Object**>(begin,end,__result);
  return;
}

Assistant:

lightlist(Iter begin, Iter end)
		: lightlist(static_cast<size_t>(end - begin)) {
		std::copy(begin, end, _PointerIterator(_data.get()));
	}